

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory_football_factory.cpp
# Opt level: O3

shared_ptr<abstract_factory::ICloth> __thiscall
abstract_factory::FootballAbstractFactory::GetCloth(FootballAbstractFactory *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<abstract_factory::ICloth> sVar1;
  undefined1 local_29;
  IAbstractFactory local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28._vptr_IAbstractFactory = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<abstract_factory::FootballCloth,std::allocator<abstract_factory::FootballCloth>>
            (a_Stack_20,(FootballCloth **)&local_28,
             (allocator<abstract_factory::FootballCloth> *)&local_29);
  (this->super_IAbstractFactory)._vptr_IAbstractFactory = local_28._vptr_IAbstractFactory;
  this[1].super_IAbstractFactory._vptr_IAbstractFactory = (_func_int **)a_Stack_20[0]._M_pi;
  sVar1.super___shared_ptr<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<abstract_factory::ICloth>)
         sVar1.super___shared_ptr<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ICloth> FootballAbstractFactory::GetCloth() {
    return std::shared_ptr<ICloth>{std::make_shared<FootballCloth>()};
}